

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::AnalyzeAccessChainLoc
          (LivenessManager *this,Instruction *ac,uint32_t curr_type_id,uint32_t *offset,bool *no_loc
          ,bool is_patch,bool input)

{
  Instruction *this_00;
  IRContext *pIVar1;
  anon_class_64_8_f868717e local_b8;
  function<bool_(const_unsigned_int_*)> local_78;
  uint32_t local_54;
  bool local_4d;
  uint32_t ocnt;
  bool skip_first_index;
  DecorationManager *pDStack_48;
  ExecutionModel stage;
  DecorationManager *deco_mgr;
  DefUseManager *def_use_mgr;
  bool input_local;
  bool *pbStack_30;
  bool is_patch_local;
  bool *no_loc_local;
  uint32_t *offset_local;
  Instruction *pIStack_18;
  uint32_t curr_type_id_local;
  Instruction *ac_local;
  LivenessManager *this_local;
  
  def_use_mgr._6_1_ = input;
  def_use_mgr._7_1_ = is_patch;
  pbStack_30 = no_loc;
  no_loc_local = (bool *)offset;
  offset_local._4_4_ = curr_type_id;
  pIStack_18 = ac;
  ac_local = (Instruction *)this;
  pIVar1 = context(this);
  deco_mgr = (DecorationManager *)IRContext::get_def_use_mgr(pIVar1);
  pIVar1 = context(this);
  pDStack_48 = IRContext::get_decoration_mgr(pIVar1);
  pIVar1 = context(this);
  ocnt = IRContext::GetStage(pIVar1);
  this_00 = pIStack_18;
  local_4d = false;
  if ((((def_use_mgr._6_1_ & 1) != 0) &&
      (((ocnt == TessellationControl || (ocnt == TessellationEvaluation)) || (ocnt == Geometry))))
     || (((def_use_mgr._6_1_ & 1) == 0 && (ocnt == TessellationControl)))) {
    local_4d = (bool)((def_use_mgr._7_1_ ^ 0xff) & 1);
  }
  local_54 = 0;
  local_b8.ocnt = &local_54;
  local_b8.def_use_mgr = (DefUseManager *)deco_mgr;
  local_b8.deco_mgr = pDStack_48;
  local_b8.curr_type_id = (uint32_t *)((long)&offset_local + 4);
  local_b8.offset = (uint32_t *)no_loc_local;
  local_b8.no_loc = pbStack_30;
  local_b8.skip_first_index = local_4d;
  local_b8.this = this;
  std::function<bool(unsigned_int_const*)>::
  function<spvtools::opt::analysis::LivenessManager::AnalyzeAccessChainLoc(spvtools::opt::Instruction_const*,unsigned_int,unsigned_int*,bool*,bool,bool)::__0,void>
            ((function<bool(unsigned_int_const*)> *)&local_78,&local_b8);
  Instruction::WhileEachInOperand(this_00,&local_78);
  std::function<bool_(const_unsigned_int_*)>::~function(&local_78);
  return offset_local._4_4_;
}

Assistant:

uint32_t LivenessManager::AnalyzeAccessChainLoc(const Instruction* ac,
                                                uint32_t curr_type_id,
                                                uint32_t* offset, bool* no_loc,
                                                bool is_patch, bool input) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // For tesc, tese and geom input variables, and tesc output variables,
  // first array index does not contribute to offset.
  auto stage = context()->GetStage();
  bool skip_first_index = false;
  if ((input && (stage == spv::ExecutionModel::TessellationControl ||
                 stage == spv::ExecutionModel::TessellationEvaluation ||
                 stage == spv::ExecutionModel::Geometry)) ||
      (!input && stage == spv::ExecutionModel::TessellationControl))
    skip_first_index = !is_patch;
  uint32_t ocnt = 0;
  ac->WhileEachInOperand([this, &ocnt, def_use_mgr, deco_mgr, &curr_type_id,
                          offset, no_loc,
                          skip_first_index](const uint32_t* opnd) {
    if (ocnt >= 1) {
      // Skip first index's contribution to offset if indicated
      Instruction* curr_type_inst = def_use_mgr->GetDef(curr_type_id);
      if (ocnt == 1 && skip_first_index) {
        assert(curr_type_inst->opcode() == spv::Op::OpTypeArray &&
               "unexpected wrapper type");
        const uint32_t kArrayElementTypeInIdx = 0;
        curr_type_id =
            curr_type_inst->GetSingleWordInOperand(kArrayElementTypeInIdx);
        ocnt++;
        return true;
      }
      // If any non-constant index, mark the entire current object and return.
      auto idx_inst = def_use_mgr->GetDef(*opnd);
      if (idx_inst->opcode() != spv::Op::OpConstant) return false;
      // If current type is struct, look for location decoration on member and
      // reset offset if found.
      auto index = idx_inst->GetSingleWordInOperand(0);
      if (curr_type_inst->opcode() == spv::Op::OpTypeStruct) {
        uint32_t loc = 0;
        bool no_mem_loc = deco_mgr->WhileEachDecoration(
            curr_type_id, uint32_t(spv::Decoration::Location),
            [&loc, index, no_loc](const Instruction& deco) {
              assert(deco.opcode() == spv::Op::OpMemberDecorate &&
                     "unexpected decoration");
              if (deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx) ==
                  index) {
                loc =
                    deco.GetSingleWordInOperand(kOpDecorateMemberLocationInIdx);
                *no_loc = false;
                return false;
              }
              return true;
            });
        if (!no_mem_loc) {
          *offset = loc;
          curr_type_id = curr_type_inst->GetSingleWordInOperand(index);
          ocnt++;
          return true;
        }
      }

      // Update offset and current type based on constant index.
      *offset += GetLocOffset(index, curr_type_id);
      curr_type_id = GetComponentType(index, curr_type_id);
    }
    ocnt++;
    return true;
  });
  return curr_type_id;
}